

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O1

int32_t ucal_getLimit_63(UCalendar *cal,UCalendarDateFields field,UCalendarLimitType type,
                        UErrorCode *status)

{
  int32_t iVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    switch(type) {
    case UCAL_MINIMUM:
      iVar1 = (**(code **)((long)*cal + 0x70))();
      return iVar1;
    case UCAL_MAXIMUM:
      iVar1 = (**(code **)((long)*cal + 0x80))();
      return iVar1;
    case UCAL_GREATEST_MINIMUM:
      iVar1 = (**(code **)((long)*cal + 0x90))();
      return iVar1;
    case UCAL_LEAST_MAXIMUM:
      iVar1 = (**(code **)((long)*cal + 0xa0))();
      return iVar1;
    case UCAL_ACTUAL_MINIMUM:
      UNRECOVERED_JUMPTABLE = *(code **)((long)*cal + 0xa8);
      break;
    case UCAL_ACTUAL_MAXIMUM:
      UNRECOVERED_JUMPTABLE = *(code **)((long)*cal + 0xb0);
      break;
    default:
      goto switchD_001ec08d_default;
    }
    iVar1 = (*UNRECOVERED_JUMPTABLE)(cal,field,status);
    return iVar1;
  }
switchD_001ec08d_default:
  return -1;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
ucal_getLimit(    const    UCalendar*              cal,
              UCalendarDateFields     field,
              UCalendarLimitType      type,
              UErrorCode        *status)
{

    if(status==0 || U_FAILURE(*status)) {
        return -1;
    }

    switch(type) {
  case UCAL_MINIMUM:
      return ((Calendar*)cal)->getMinimum(field);

  case UCAL_MAXIMUM:
      return ((Calendar*)cal)->getMaximum(field);

  case UCAL_GREATEST_MINIMUM:
      return ((Calendar*)cal)->getGreatestMinimum(field);

  case UCAL_LEAST_MAXIMUM:
      return ((Calendar*)cal)->getLeastMaximum(field);

  case UCAL_ACTUAL_MINIMUM:
      return ((Calendar*)cal)->getActualMinimum(field,
          *status);

  case UCAL_ACTUAL_MAXIMUM:
      return ((Calendar*)cal)->getActualMaximum(field,
          *status);

  default:
      break;
    }
    return -1;
}